

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

void __thiscall
ON_SubDMeshFragment::Internal_LayoutArrays
          (ON_SubDMeshFragment *this,size_t vertex_capacity,double *PNTKC_array)

{
  double *pdVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  size_t vertex_capacity_00;
  bool bVar5;
  bool bVar6;
  
  bVar5 = vertex_capacity < 4;
  bVar6 = PNTKC_array != (double *)0x0;
  if (!bVar6 && !bVar5) {
    PNTKC_array = (double *)
                  operator_new__(-(ulong)(vertex_capacity * 0xc >> 0x3d != 0) |
                                 vertex_capacity * 0x60,(nothrow_t *)&std::nothrow);
  }
  Clear(this);
  uVar4 = vertex_capacity - 0x1001;
  if (PNTKC_array == (double *)0x0) {
    vertex_capacity = 0;
  }
  vertex_capacity_00 = 0;
  if (0xfffffffffffff002 < uVar4) {
    vertex_capacity_00 = vertex_capacity;
  }
  if (bVar6 || bVar5) {
    SetUnmanagedVertexCapacityForExperts(this,vertex_capacity_00);
  }
  else {
    this->m_vertex_capacity_etc =
         (ushort)vertex_capacity_00 | this->m_vertex_capacity_etc & 0x6000 | 0x8000;
  }
  if (uVar4 < 0xfffffffffffff003) {
    PNTKC_array = (double *)0x0;
  }
  uVar4 = (ulong)(PNTKC_array != (double *)0x0);
  lVar2 = vertex_capacity_00 * 3;
  if (PNTKC_array == (double *)0x0) {
    vertex_capacity_00 = 0;
    lVar2 = 0;
  }
  sVar3 = uVar4 * 3;
  this->m_P = PNTKC_array;
  this->m_P_stride = sVar3;
  pdVar1 = PNTKC_array + lVar2;
  this->m_N = pdVar1;
  this->m_N_stride = sVar3;
  pdVar1 = pdVar1 + lVar2;
  this->m_T = pdVar1;
  this->m_T_stride = sVar3;
  this->m_K = (ON_SurfaceCurvature *)(pdVar1 + lVar2);
  this->m_K_stride = uVar4;
  this->m_C = (ON_Color *)((ON_SurfaceCurvature *)(pdVar1 + lVar2) + vertex_capacity_00);
  this->m_C_stride = uVar4;
  return;
}

Assistant:

void ON_SubDMeshFragment::Internal_LayoutArrays(
  size_t vertex_capacity,
  double* PNTKC_array
)
{
  const bool bManagedArray = (vertex_capacity >= 4 && nullptr == PNTKC_array);
  if (bManagedArray)
  {
    const size_t double_capacity = ON_SubDMeshFragment::DoublesPerVertex * vertex_capacity;
    // PNTKC_array will be deleted in ON_SubDMeshFragment::DeleteManagedArrays().
    PNTKC_array = new(std::nothrow) double[double_capacity];
  }


  this->SetVertexCount(0);

  if (nullptr == PNTKC_array || vertex_capacity < 4 || vertex_capacity > ((size_t)ON_SubDMeshFragment::MaximumVertexCount) )
  {
    PNTKC_array = nullptr;
    vertex_capacity = 0;
  }
  if (bManagedArray)
  {
    unsigned short etc = (m_vertex_capacity_etc & ON_SubDMeshFragment::EtcMask);
    etc |= ON_SubDMeshFragment::EtcManagedArraysBit;
    m_vertex_capacity_etc = (unsigned short)vertex_capacity;
    m_vertex_capacity_etc |= etc;
  }
  else
  {
    this->SetUnmanagedVertexCapacityForExperts(vertex_capacity);
  }

  // If needed, bInterlaced can become a parameter in this private function.
  // bInterlaced - [in]  
  //   True if the points, normals, textures, colors, and curvatures should be interlaced.
  //   False if the points, normals, textures, colors, and curvatures should be in
  //   contiguous memory.
  const bool bInterlaced = false;

  // stride_PNT = number of double elements to get from m_P[i] to m_P[i+1] (dittof for m_N[] and m_T[])
  const size_t stride_PNT
    = (nullptr != PNTKC_array)
    ? (bInterlaced ? ON_SubDMeshFragment::DoublesPerVertex : 3)
    : 0;

  // offset_PNT = offset between start of m_P, m_N, m_T, m_K
  const size_t offset_PNT
    = (nullptr != PNTKC_array)
    ? 3 * (bInterlaced ? 1 : vertex_capacity)
    : 0;

  // stride_K = number of ON_SubDSurfaceCurvature elements to get from m_K[i] to m_K[i+1]
  const size_t stride_K
    = (nullptr != PNTKC_array)
    ? (bInterlaced ? (ON_SubDMeshFragment::DoublesPerVertex * sizeof(double)) / sizeof(m_K[0]) : 1)
    : 0;

  // offset_K = offset between m_K and m_C
  const size_t offset_K
    = (nullptr != PNTKC_array)
    ? (bInterlaced ? 1 : vertex_capacity)
    : 0;

  // stride_C = number of ON_Color elements to get from m_C[i] to m_C[i+1]
  const size_t stride_C
    = (nullptr != PNTKC_array)
    ? (bInterlaced ? (ON_SubDMeshFragment::DoublesPerVertex * sizeof(double)) / sizeof(m_C[0]) : 1)
    : 0;

  m_P = PNTKC_array;
  m_P_stride = stride_PNT;

  m_N = m_P + offset_PNT;
  m_N_stride = stride_PNT;

  m_T = m_N + offset_PNT;
  m_T_stride = stride_PNT;

  m_K = (ON_SurfaceCurvature*)(m_T + offset_PNT);
  m_K_stride = stride_K;

  m_C = (ON_Color*)(m_K + offset_K);
  m_C_stride = stride_C;
}